

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdNormalizeSignature(void *handle,char *signature,char **normalized_signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_79;
  undefined1 local_78 [32];
  ByteData result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_78._0_8_ = "cfdcapi_key.cpp";
    local_78._8_4_ = 0x3d1;
    local_78._16_8_ = "CfdNormalizeSignature";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to parameter. signature is null or empty.",
               (allocator *)&result);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (normalized_signature != (char **)0x0) {
    std::__cxx11::string::string((string *)local_78,signature,&local_79);
    cfd::core::ByteData::ByteData((ByteData *)&local_40,(string *)local_78);
    cfd::core::CryptoUtil::NormalizeSignature(&result,(ByteData *)&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::__cxx11::string::~string((string *)local_78);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_78,&result);
    pcVar2 = cfd::capi::CreateString((string *)local_78);
    *normalized_signature = pcVar2;
    std::__cxx11::string::~string((string *)local_78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&result);
    return 0;
  }
  local_78._0_8_ = "cfdcapi_key.cpp";
  local_78._8_4_ = 0x3d7;
  local_78._16_8_ = "CfdNormalizeSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"normalized_signature is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to parameter. normalized_signature is null.",
             (allocator *)&result);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdNormalizeSignature(
    void* handle, const char* signature, char** normalized_signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (normalized_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "normalized_signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. normalized_signature is null.");
    }

    ByteData result = CryptoUtil::NormalizeSignature(ByteData(signature));
    *normalized_signature = CreateString(result.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}